

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

Own<kj::(anonymous_namespace)::TeeBranch> __thiscall
kj::heap<kj::(anonymous_namespace)::TeeBranch,kj::Own<kj::(anonymous_namespace)::AsyncTee>,int>
          (kj *this,Own<kj::(anonymous_namespace)::AsyncTee> *params,int *params_1)

{
  uint uVar1;
  Disposer *pDVar2;
  AsyncTee *pAVar3;
  undefined8 *puVar4;
  TeeBranch *extraout_RDX;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  Own<kj::(anonymous_namespace)::TeeBranch> OVar8;
  Fault f;
  _Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_> local_78;
  undefined8 local_28;
  
  puVar4 = (undefined8 *)operator_new(0x20);
  pDVar2 = params->disposer;
  pAVar3 = params->ptr;
  params->ptr = (AsyncTee *)0x0;
  uVar1 = *params_1;
  *puVar4 = &PTR_read_004689d8;
  puVar4[1] = pDVar2;
  puVar4[2] = pAVar3;
  *(char *)(puVar4 + 3) = (char)uVar1;
  UnwindDetector::UnwindDetector((UnwindDetector *)((long)puVar4 + 0x1c));
  lVar6 = puVar4[2];
  uVar5 = (ulong)((uVar1 & 0xff) * 0x60);
  if (*(char *)(lVar6 + 0x38 + uVar5) != '\x01') {
    local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
    local_28 = 0;
    std::_Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::
    _M_initialize_map(&local_78,0);
    lVar6 = lVar6 + uVar5;
    pcVar7 = (char *)(lVar6 + 0x38);
    local_28 = 0;
    if (*pcVar7 == '\x01') {
      *pcVar7 = '\0';
      std::deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::~deque
                ((deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_> *)
                 (lVar6 + 0x40));
    }
    std::_Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::
    _Deque_base((_Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_> *
                )(lVar6 + 0x40),&local_78);
    *(undefined8 *)(lVar6 + 0x90) = local_28;
    *pcVar7 = '\x01';
    std::deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::~deque
              ((deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_> *)
               &local_78);
    *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::TeeBranch>::instance;
    *(undefined8 **)(this + 8) = puVar4;
    OVar8.ptr = extraout_RDX;
    OVar8.disposer = (Disposer *)this;
    return OVar8;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
            ((Fault *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,0x4c1,FAILED,"branches[branch] == nullptr","\"branch already exists\"",
             (char (*) [22])"branch already exists");
  _::Debug::Fault::fatal((Fault *)&local_78);
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}